

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

uint32_t FAudioSourceVoice_SetFrequencyRatio
                   (FAudioSourceVoice *voice,float Ratio,uint32_t OperationSet)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  
  if ((OperationSet == 0) || (voice->audio->active == '\0')) {
    if ((voice->flags & 2) == 0) {
      fVar1 = (voice->field_19).src.maxFreqRatio;
      fVar3 = 0.0009765625;
      if (0.0009765625 <= Ratio) {
        fVar3 = Ratio;
      }
      uVar2 = -(uint)(fVar1 < Ratio);
      (voice->field_19).src.freqRatio = (float)(uVar2 & (uint)fVar1 | ~uVar2 & (uint)fVar3);
    }
  }
  else {
    FAudio_OPERATIONSET_QueueSetFrequencyRatio(voice,Ratio,OperationSet);
  }
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_SetFrequencyRatio(
	FAudioSourceVoice *voice,
	float Ratio,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetFrequencyRatio(
			voice,
			Ratio,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}
	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);

	if (voice->flags & FAUDIO_VOICE_NOPITCH)
	{
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	voice->src.freqRatio = FAudio_clamp(
		Ratio,
		FAUDIO_MIN_FREQ_RATIO,
		voice->src.maxFreqRatio
	);
	LOG_API_EXIT(voice->audio)
	return 0;
}